

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void HorizontalPred_SSE2(uint8_t *dst,uint8_t *left,int size)

{
  int in_EDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  int in_stack_ffffffffffffffe8;
  
  if (in_RSI == (uint8_t *)0x0) {
    Fill_SSE2((uint8_t *)0x0,in_EDX,in_stack_ffffffffffffffe8);
  }
  else if (in_EDX == 8) {
    HE8uv_SSE2(in_RDI,in_RSI);
  }
  else {
    HE16_SSE2(in_RDI,in_RSI);
  }
  return;
}

Assistant:

static WEBP_INLINE void HorizontalPred_SSE2(uint8_t* dst,
                                            const uint8_t* left, int size) {
  if (left != NULL) {
    if (size == 8) {
      HE8uv_SSE2(dst, left);
    } else {
      HE16_SSE2(dst, left);
    }
  } else {
    Fill_SSE2(dst, 129, size);
  }
}